

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-shutdown-close.c
# Opt level: O3

int run_test_shutdown_close_pipe(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_shutdown_t *puVar2;
  undefined8 uVar3;
  int iVar4;
  undefined1 *puVar5;
  uv_pipe_t h;
  undefined1 local_110 [264];
  
  puVar2 = (uv_shutdown_t *)uv_default_loop();
  puVar5 = local_110;
  iVar1 = uv_pipe_init(puVar2,puVar5,0);
  iVar4 = (int)puVar5;
  if (iVar1 == 0) {
    uv_pipe_connect(&connect_req,local_110,"/tmp/uv-test-sock",connect_cb);
    puVar2 = (uv_shutdown_t *)uv_default_loop();
    iVar4 = 0;
    iVar1 = uv_run();
    if (iVar1 != 0) goto LAB_0016a57f;
    if (connect_cb_called != 1) goto LAB_0016a584;
    if (shutdown_cb_called != 1) goto LAB_0016a589;
    if (close_cb_called == 1) {
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      iVar4 = 0;
      uv_run(uVar3);
      puVar2 = (uv_shutdown_t *)uv_default_loop();
      iVar1 = uv_loop_close();
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0016a593;
    }
  }
  else {
    run_test_shutdown_close_pipe_cold_1();
LAB_0016a57f:
    run_test_shutdown_close_pipe_cold_2();
LAB_0016a584:
    run_test_shutdown_close_pipe_cold_3();
LAB_0016a589:
    run_test_shutdown_close_pipe_cold_4();
  }
  run_test_shutdown_close_pipe_cold_5();
LAB_0016a593:
  run_test_shutdown_close_pipe_cold_6();
  if (puVar2 == &shutdown_req) {
    if ((iVar4 == -0x7d) || (iVar4 == 0)) {
      shutdown_cb_called = shutdown_cb_called + 1;
      return extraout_EAX;
    }
  }
  else {
    shutdown_cb_cold_1();
  }
  shutdown_cb_cold_2();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(shutdown_close_pipe) {
  uv_pipe_t h;
  int r;

  r = uv_pipe_init(uv_default_loop(), &h, 0);
  ASSERT(r == 0);
  uv_pipe_connect(&connect_req, &h, TEST_PIPENAME, connect_cb);
  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(connect_cb_called == 1);
  ASSERT(shutdown_cb_called == 1);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}